

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O1

bool __thiscall
vkt::synchronization::anon_unknown_0::MultiQueues::getFreeQueue
          (MultiQueues *this,deUint32 *returnQueueFamilyIndex,VkQueue *returnQueues,
          int *returnQueueIndex)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  deUint32 *pdVar5;
  mapped_type *pmVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  
  iVar7 = (int)(this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  bVar8 = 0 < iVar7;
  if (0 < iVar7) {
    iVar7 = 0;
    do {
      pdVar5 = getQueueFamilyIndex(this,iVar7);
      pmVar6 = std::
               map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType>_>_>
               ::operator[](&this->m_queues,pdVar5);
      iVar4 = (int)((ulong)((long)(pmVar6->queues).
                                  super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pmVar6->queues).
                                 super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      bVar3 = 0 < iVar4;
      if (0 < iVar4) {
        uVar9 = 0;
        do {
          deMutex_lock((this->m_mutex).m_mutex);
          p_Var1 = (pmVar6->available).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar2 = p_Var1[uVar9 >> 6];
          if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
            p_Var1[uVar9 >> 6] = uVar2 & ~(1L << ((byte)uVar9 & 0x3f));
            pdVar5 = getQueueFamilyIndex(this,iVar7);
            *returnQueueFamilyIndex = *pdVar5;
            *returnQueues =
                 (pmVar6->queues).
                 super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
            *returnQueueIndex = (int)uVar9;
            deMutex_unlock((this->m_mutex).m_mutex);
            if (bVar3) {
              return bVar8;
            }
            break;
          }
          deMutex_unlock((this->m_mutex).m_mutex);
          uVar9 = uVar9 + 1;
          iVar4 = (int)((ulong)((long)(pmVar6->queues).
                                      super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pmVar6->queues).
                                     super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
          bVar3 = (int)uVar9 < iVar4;
        } while ((int)uVar9 < iVar4);
      }
      iVar7 = iVar7 + 1;
      iVar4 = (int)(this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      bVar8 = iVar7 < iVar4;
    } while (iVar7 < iVar4);
  }
  return bVar8;
}

Assistant:

bool			getFreeQueue			(deUint32& returnQueueFamilyIndex, VkQueue& returnQueues, int& returnQueueIndex)
	{
		for (int queueFamilyIndexNdx = 0 ; queueFamilyIndexNdx < static_cast<int>(m_queues.size()); ++queueFamilyIndexNdx)
		{
			Queues& queue = m_queues[getQueueFamilyIndex(queueFamilyIndexNdx)];
			for (int queueNdx = 0; queueNdx < static_cast<int>(queue.queues.size()); ++queueNdx)
			{
				m_mutex.lock();
				if (queue.available[queueNdx])
				{
					queue.available[queueNdx]	= false;
					returnQueueFamilyIndex		= getQueueFamilyIndex(queueFamilyIndexNdx);
					returnQueues				= queue.queues[queueNdx];
					returnQueueIndex			= queueNdx;
					m_mutex.unlock();
					return true;
				}
				m_mutex.unlock();
			}
		}
		return false;
	}